

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenRefFuncSetFunc(BinaryenExpressionRef expr,char *funcName)

{
  bool bVar1;
  Name local_30;
  BinaryenExpressionRef local_20;
  Expression *expression;
  char *funcName_local;
  BinaryenExpressionRef expr_local;
  
  local_20 = expr;
  expression = (Expression *)funcName;
  funcName_local = (char *)expr;
  bVar1 = wasm::Expression::is<wasm::RefFunc>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<RefFunc>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xe38,"void BinaryenRefFuncSetFunc(BinaryenExpressionRef, const char *)");
  }
  wasm::Name::Name(&local_30,(char *)expression);
  wasm::Name::operator=((Name *)(local_20 + 1),&local_30);
  return;
}

Assistant:

void BinaryenRefFuncSetFunc(BinaryenExpressionRef expr, const char* funcName) {
  auto* expression = (Expression*)expr;
  assert(expression->is<RefFunc>());
  static_cast<RefFunc*>(expression)->func = funcName;
}